

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O1

void deqp::gles2::Accuracy::randomPartition
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst,Random *rnd,
               int x,int y,int width,int height)

{
  deBool dVar1;
  deUint32 dVar2;
  int width_00;
  ulong uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  int local_4c;
  Vector<int,_4> local_40;
  
  uVar3 = (ulong)(uint)width;
  local_4c = x;
  while( true ) {
    while( true ) {
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      width_00 = (int)uVar3;
      bVar6 = false;
      if ((8 < width_00) && (bVar6 = false, 0.4 < fVar7)) {
        dVar1 = deRandom_getBool(&rnd->m_rnd);
        bVar6 = dVar1 == 1;
      }
      if (!bVar6) break;
      iVar5 = 3 - width_00;
      if (width_00 < 1) {
        iVar5 = -width_00;
      }
      iVar4 = width_00 + 3;
      if (-1 < width_00) {
        iVar4 = width_00;
      }
      dVar2 = deRandom_getUint32(&rnd->m_rnd);
      iVar5 = (iVar5 >> 2) + ((int)(uVar3 >> 0x1f) + width_00 >> 1) +
              dVar2 % (((iVar4 >> 2) - (iVar5 >> 2)) + 1U);
      randomPartition(dst,rnd,local_4c,y,iVar5,height);
      local_4c = local_4c + iVar5;
      uVar3 = (ulong)(uint)(width_00 - iVar5);
    }
    if ((fVar7 <= 0.4) || (height < 9)) break;
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    iVar5 = (dVar2 % ((uint)height >> 1 | 1) - ((uint)height >> 2)) + ((uint)height >> 1);
    randomPartition(dst,rnd,local_4c,y,width_00,iVar5);
    y = y + iVar5;
    height = height - iVar5;
  }
  local_40.m_data[0] = local_4c;
  local_40.m_data[1] = y;
  local_40.m_data[2] = width_00;
  local_40.m_data[3] = height;
  std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
  emplace_back<tcu::Vector<int,4>>
            ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)dst,&local_40);
  return;
}

Assistant:

static void randomPartition (vector<IVec4>& dst, de::Random& rnd, int x, int y, int width, int height)
{
	const int minWidth	= 8;
	const int minHeight	= 8;

	bool	partition		= rnd.getFloat() > 0.4f;
	bool	partitionX		= partition && width > minWidth && rnd.getBool();
	bool	partitionY		= partition && height > minHeight && !partitionX;

	if (partitionX)
	{
		int split = width/2 + rnd.getInt(-width/4, +width/4);
		randomPartition(dst, rnd, x, y, split, height);
		randomPartition(dst, rnd, x+split, y, width-split, height);
	}
	else if (partitionY)
	{
		int split = height/2 + rnd.getInt(-height/4, +height/4);
		randomPartition(dst, rnd, x, y, width, split);
		randomPartition(dst, rnd, x, y+split, width, height-split);
	}
	else
		dst.push_back(IVec4(x, y, width, height));
}